

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *dctx)

{
  U32 UVar1;
  ZSTD_DDictHashSet *pZVar2;
  ZSTD_DDict *pZVar3;
  xxh_u64 xVar4;
  ulong uVar5;
  XXH_alignment in_ECX;
  ulong uVar6;
  U32 UVar7;
  U32 local_1c;
  
  if ((dctx->refMultipleDDicts != ZSTD_rmd_refSingleDDict) &&
     (pZVar2 = dctx->ddictSet, pZVar2 != (ZSTD_DDictHashSet *)0x0)) {
    if (dctx->ddict != (ZSTD_DDict *)0x0) {
      UVar1 = (dctx->fParams).dictID;
      local_1c = UVar1;
      xVar4 = XXH64_finalize(0x27d4eb2f165667c9,(xxh_u8 *)&local_1c,4,in_ECX);
      uVar6 = pZVar2->ddictPtrTableSize - 1;
      uVar5 = xVar4 & uVar6;
      while( true ) {
        pZVar3 = pZVar2->ddictPtrTable[uVar5];
        if (pZVar3 == (ZSTD_DDict *)0x0) {
          UVar7 = 0;
        }
        else {
          UVar7 = pZVar3->dictID;
        }
        if (UVar7 == 0 || UVar7 == UVar1) break;
        uVar5 = (uVar5 & uVar6) + 1;
      }
      pZVar3 = pZVar2->ddictPtrTable[uVar5];
      if (pZVar3 != (ZSTD_DDict *)0x0) {
        ZSTD_freeDDict(dctx->ddictLocal);
        dctx->ddictLocal = (ZSTD_DDict *)0x0;
        dctx->ddict = (ZSTD_DDict *)0x0;
        dctx->dictID = (dctx->fParams).dictID;
        dctx->ddict = pZVar3;
        dctx->dictUses = ZSTD_use_indefinitely;
      }
    }
    return;
  }
  __assert_fail("dctx->refMultipleDDicts && dctx->ddictSet",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9cb1,"void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *)");
}

Assistant:

static void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx* dctx) {
    assert(dctx->refMultipleDDicts && dctx->ddictSet);
    DEBUGLOG(4, "Adjusting DDict based on requested dict ID from frame");
    if (dctx->ddict) {
        const ZSTD_DDict* frameDDict = ZSTD_DDictHashSet_getDDict(dctx->ddictSet, dctx->fParams.dictID);
        if (frameDDict) {
            DEBUGLOG(4, "DDict found!");
            ZSTD_clearDict(dctx);
            dctx->dictID = dctx->fParams.dictID;
            dctx->ddict = frameDDict;
            dctx->dictUses = ZSTD_use_indefinitely;
        }
    }
}